

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_klass.hpp
# Opt level: O3

Klass<Foo,_void> * __thiscall
squall::Klass<Foo,void>::func<int(Foo::*)(std::__cxx11::string_const&)>
          (Klass<Foo,void> *this,string *name,offset_in_Foo_to_subr f)

{
  int iVar1;
  HSQUIRRELVM vm;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _Atomic_word _Var2;
  undefined8 in_RCX;
  SQObjectValue extraout_RDX;
  bool bVar3;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  HSQOBJECT local_40;
  
  vm = (HSQUIRRELVM)**(undefined8 **)this;
  this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 0x10);
  _Var2 = this_00->_M_use_count;
  do {
    LOCK();
    iVar1 = this_00->_M_use_count;
    bVar3 = _Var2 == iVar1;
    if (bVar3) {
      this_00->_M_use_count = _Var2 + 1;
      iVar1 = _Var2;
    }
    _Var2 = iVar1;
    UNLOCK();
  } while (!bVar3);
  local_40._type = (**(code **)(**(long **)(this + 8) + 0x18))();
  local_58 = (code *)0x0;
  pcStack_50 = (code *)0x0;
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  if (f != 0) {
    pcStack_50 = std::
                 _Function_handler<int_(Foo_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_int_(Foo::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<int_(Foo_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_int_(Foo::*)(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               ::_M_manager;
    local_68._M_unused._M_member_pointer = f;
    local_68._8_8_ = in_RCX;
  }
  local_40._unVal = extraout_RDX;
  detail::defun_local<int,Foo*,std::__cxx11::string_const&>
            (vm,&local_40,name,
             (function<int_(Foo_*,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return (Klass<Foo,_void> *)this;
}

Assistant:

Klass<C, Base>& func(const string& name, F f) {
        detail::defun_local(
            vm_.handle(),
            imp_.lock()->get_klass_object(),
            name,
            to_function(f));
        return *this;
    }